

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_dnref_search(compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks)

{
  jump_list *list;
  sljit_compiler *psVar1;
  sljit_compiler *list_00;
  sljit_jump *psVar2;
  sljit_label *label;
  jump_list *local_48;
  jump_list *found;
  ushort *puStack_38;
  uint offset;
  PCRE2_SPTR16 slot;
  sljit_compiler *psStack_28;
  int count;
  sljit_compiler *compiler;
  jump_list **backtracks_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  psStack_28 = common->compiler;
  slot._4_4_ = (uint)cc[2];
  puStack_38 = common->name_table + (ulong)cc[1] * common->name_entry_size;
  local_48 = (jump_list *)0x0;
  compiler = (sljit_compiler *)backtracks;
  backtracks_local = (jump_list **)cc;
  cc_local = (PCRE2_SPTR16)common;
  sljit_emit_op1(psStack_28,0x20,1,0,0x8e,(long)common->ovector_start + 8);
  slot._4_4_ = slot._4_4_ - 1;
  while (0 < (int)slot._4_4_) {
    found._4_4_ = (uint)*puStack_38 << 1;
    slot._4_4_ = slot._4_4_ + -1;
    sljit_get_local_base(psStack_28,4,0,(long)*(int *)(cc_local + 0x22) + (ulong)*puStack_38 * 0x10)
    ;
    psVar1 = psStack_28;
    psVar2 = sljit_emit_cmp(psStack_28,1,0x8e,
                            (long)*(int *)(cc_local + 0x22) + (ulong)found._4_4_ * 8,1,0);
    add_jump(psVar1,&local_48,psVar2);
    puStack_38 = puStack_38 + *(long *)(cc_local + 0x74);
  }
  found._4_4_ = (uint)*puStack_38 << 1;
  slot._4_4_ = slot._4_4_ + -1;
  sljit_get_local_base(psStack_28,4,0,(long)*(int *)(cc_local + 0x22) + (ulong)*puStack_38 * 0x10);
  list_00 = compiler;
  psVar1 = psStack_28;
  if ((compiler != (sljit_compiler *)0x0) && (*(int *)(cc_local + 0xdc) == 0)) {
    psVar2 = sljit_emit_cmp(psStack_28,0,0x8e,
                            (long)*(int *)(cc_local + 0x22) + (ulong)found._4_4_ * 8,1,0);
    add_jump(psVar1,(jump_list **)list_00,psVar2);
  }
  list = local_48;
  label = sljit_emit_label(psStack_28);
  set_jumps(list,label);
  return;
}

Assistant:

static void compile_dnref_search(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks)
{
/* The OVECTOR offset goes to TMP2. */
DEFINE_COMPILER;
int count = GET2(cc, 1 + IMM2_SIZE);
PCRE2_SPTR slot = common->name_table + GET2(cc, 1) * common->name_entry_size;
unsigned int offset;
jump_list *found = NULL;

SLJIT_ASSERT(*cc == OP_DNREF || *cc == OP_DNREFI);

OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1));

count--;
while (count-- > 0)
  {
  offset = GET2(slot, 0) << 1;
  GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
  add_jump(compiler, &found, CMP(SLJIT_NOT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));
  slot += common->name_entry_size;
  }

offset = GET2(slot, 0) << 1;
GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
if (backtracks != NULL && !common->unset_backref)
  add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));

set_jumps(found, LABEL());
}